

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmd_line.hpp
# Opt level: O3

void __thiscall Args::CmdLine::clear(CmdLine *this)

{
  pointer puVar1;
  pointer ppCVar2;
  pointer puVar3;
  
  puVar1 = (this->m_args).
           super__Vector_base<std::unique_ptr<Args::ArgIface,_Args::details::Deleter<Args::ArgIface>_>,_std::allocator<std::unique_ptr<Args::ArgIface,_Args::details::Deleter<Args::ArgIface>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  for (puVar3 = (this->m_args).
                super__Vector_base<std::unique_ptr<Args::ArgIface,_Args::details::Deleter<Args::ArgIface>_>,_std::allocator<std::unique_ptr<Args::ArgIface,_Args::details::Deleter<Args::ArgIface>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start; puVar3 != puVar1; puVar3 = puVar3 + 1) {
    (*((puVar3->_M_t).super___uniq_ptr_impl<Args::ArgIface,_Args::details::Deleter<Args::ArgIface>_>
       ._M_t.super__Tuple_impl<0UL,_Args::ArgIface_*,_Args::details::Deleter<Args::ArgIface>_>.
       super__Head_base<0UL,_Args::ArgIface_*,_false>._M_head_impl)->_vptr_ArgIface[0xd])();
  }
  this->m_command = (Command *)0x0;
  this->m_currCommand = (Command *)0x0;
  ppCVar2 = (this->m_prevCommand).
            super__Vector_base<Args::Command_*,_std::allocator<Args::Command_*>_>._M_impl.
            super__Vector_impl_data._M_start;
  if ((this->m_prevCommand).super__Vector_base<Args::Command_*,_std::allocator<Args::Command_*>_>.
      _M_impl.super__Vector_impl_data._M_finish != ppCVar2) {
    (this->m_prevCommand).super__Vector_base<Args::Command_*,_std::allocator<Args::Command_*>_>.
    _M_impl.super__Vector_impl_data._M_finish = ppCVar2;
  }
  return;
}

Assistant:

void clear()
	{
		std::for_each( arguments().begin(), arguments().end(),
			[] ( const auto & a ) { a->clear(); } );

		m_command = nullptr;
		m_currCommand = nullptr;
		m_prevCommand.clear();
	}